

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void Style::addFieldAlias(Entry *entry,u16string *alias,u16string *actual)

{
  initializer_list<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  __l;
  bool bVar1;
  pointer ppVar2;
  Constraints *this;
  reference __lhs;
  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
  *pvVar3;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_2a0;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_258;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_250;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_248;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_240;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *local_238;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *fields_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
  *__range1_1;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_210;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_208;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_200;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *local_1f8;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *fields;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
  *__range1;
  allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_1c9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_1c8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_1c0;
  u16string local_1a0 [32];
  undefined1 local_180 [40];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_158;
  const_iterator local_150;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  local_148;
  iterator end;
  iterator itr2;
  Constraints *constraints;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
  local_120;
  undefined1 local_90 [8];
  Field actualFieldCopy;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
  local_28;
  iterator itr;
  u16string *actual_local;
  u16string *alias_local;
  Entry *entry_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
               )actual;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
       ::find(&entry->fields,actual);
  actualFieldCopy.pattern.field_2._8_8_ =
       std::
       unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
       ::end(&entry->fields);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                      *)((long)&actualFieldCopy.pattern.field_2 + 8));
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_false,_true>
                           *)&local_28);
    Field::Field((Field *)local_90,&ppVar2->second);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              local_90,alias);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::pair<Style::Field_&,_true>(&local_120,alias,(Field *)local_90);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
    ::insert(&entry->fields,&local_120);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::~pair(&local_120);
    this = &entry->constraints;
    end = std::
          vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
          ::begin(&this->all);
    local_148._M_current =
         (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
         std::
         vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
         ::end(&this->all);
LAB_0020519f:
    bVar1 = __gnu_cxx::operator!=(&end,&local_148);
    if (bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
              ::operator*(&end);
      bVar1 = std::operator==(__lhs,(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                     *)itr.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                                       ._M_cur);
      if (!bVar1) goto LAB_0020546b;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::u16string_const*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
      ::__normal_iterator<std::__cxx11::u16string*>
                ((__normal_iterator<std::__cxx11::u16string_const*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
                  *)&local_150,&end);
      local_158 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ::erase(&this->all,local_150);
      local_1c8 = &local_1c0;
      std::__cxx11::u16string::u16string
                ((u16string *)local_1c8,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 itr.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                 ._M_cur);
      local_1c8 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  local_1a0;
      std::__cxx11::u16string::u16string((u16string *)local_1c8,alias);
      local_180._0_8_ = &local_1c0;
      local_180._8_8_ = 2;
      std::
      allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::allocator(&local_1c9);
      __l._M_len = local_180._8_8_;
      __l._M_array = (iterator)local_180._0_8_;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                *)(local_180 + 0x10),__l,&local_1c9);
      std::
      vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
      ::emplace_back<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
                ((vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
                  *)&(entry->constraints).one,
                 (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  *)(local_180 + 0x10));
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                 *)(local_180 + 0x10));
      std::
      allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::~allocator(&local_1c9);
      local_2a0 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  local_180;
      do {
        local_2a0 = local_2a0 + -1;
        std::__cxx11::u16string::~u16string((u16string *)local_2a0);
      } while (local_2a0 != &local_1c0);
      goto LAB_002056c2;
    }
    pvVar3 = &(entry->constraints).some;
    __end1 = std::
             vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
             ::begin(pvVar3);
    fields = (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)std::
                vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                                       *)&fields), bVar1) {
      local_1f8 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  __gnu_cxx::
                  __normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                  ::operator*(&__end1);
      local_208._M_current =
           (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
           std::
           vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                    *)local_1f8);
      local_210 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                         *)local_1f8);
      local_200 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,std::__cxx11::u16string>
                            (local_208,
                             (__normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
                              )local_210,
                             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                              *)itr.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                                ._M_cur);
      __range1_1 = (vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                    *)std::
                      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                             *)local_1f8);
      bVar1 = __gnu_cxx::operator!=
                        (&local_200,
                         (__normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
                          *)&__range1_1);
      if (bVar1) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(local_1f8,alias);
        goto LAB_002056c2;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
      ::operator++(&__end1);
    }
    pvVar3 = &(entry->constraints).one;
    __end1_1 = std::
               vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
               ::begin(pvVar3);
    fields_1 = (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                *)std::
                  vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                  ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                               *)&fields_1), bVar1) {
      local_238 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  __gnu_cxx::
                  __normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
                  ::operator*(&__end1_1);
      local_248._M_current =
           (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
           std::
           vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                    *)local_238);
      local_250 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                         *)local_238);
      local_240 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,std::__cxx11::u16string>
                            (local_248,
                             (__normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
                              )local_250,
                             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                              *)itr.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                                ._M_cur);
      local_258._M_current =
           (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
           std::
           vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  *)local_238);
      bVar1 = __gnu_cxx::operator!=(&local_240,&local_258);
      if (bVar1) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(local_238,alias);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
      ::operator++(&__end1_1);
    }
LAB_002056c2:
    Field::~Field((Field *)local_90);
  }
  return;
LAB_0020546b:
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  ::operator++(&end,0);
  goto LAB_0020519f;
}

Assistant:

void addFieldAlias (Entry &entry, const u16string &alias, const u16string &actual) {
    auto itr = entry.fields.find(actual);
    if (itr == entry.fields.end()) return;

    Field actualFieldCopy = itr->second;
    actualFieldCopy.name = alias;

    entry.fields.insert({ alias, actualFieldCopy });


    // TODO: Well, you get the idea
    auto &constraints = entry.constraints;
    for (auto itr2 = constraints.all.begin(), end = constraints.all.end(); itr2 != end; itr2++) {
        if (*itr2 == actual) {
            constraints.all.erase(itr2);
            constraints.one.emplace_back(vector { actual, alias });
            return;
        }
    }

    for (auto &fields : constraints.some) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }

    for (auto &fields : constraints.one) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }
}